

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_sp.c
# Opt level: O1

int16_t WebRtcVad_FindMinimum(VadInstT *self,int16_t feature_value,int channel)

{
  undefined2 uVar1;
  int iVar2;
  bool bVar3;
  short sVar4;
  int16_t iVar5;
  int16_t *piVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int16_t *piVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  
  if (5 < channel) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/common_audio/vad/vad_sp.c"
            ,0x49,"DCHECK failed: (channel) < (kNumChannels)");
    exit(1);
  }
  lVar8 = (long)(channel << 4);
  piVar6 = self->low_value_vector + lVar8;
  piVar10 = self->low_value_vector + lVar8 + 1;
  lVar11 = 1;
  uVar12 = 0;
  do {
    uVar7 = 0xe;
    if (0xe < uVar12) {
      uVar7 = uVar12;
    }
    if (self->index_vector[lVar8 + uVar12] == 100) {
      if (uVar12 != 0xf) {
        lVar13 = 0;
        do {
          piVar10[lVar13 + -1] = piVar10[lVar13];
          piVar10[lVar13 + -0x61] = piVar10[lVar13 + -0x60];
          lVar13 = lVar13 + 1;
        } while (uVar7 + lVar11 != lVar13);
      }
      self->index_vector[lVar8 + 0xf] = 0x65;
      self->low_value_vector[lVar8 + 0xf] = 10000;
    }
    else {
      self->index_vector[lVar8 + uVar12] = self->index_vector[lVar8 + uVar12] + 1;
    }
    uVar12 = uVar12 + 1;
    piVar10 = piVar10 + 1;
    lVar11 = lVar11 + -1;
  } while (uVar12 != 0x10);
  if (feature_value < self->low_value_vector[lVar8 + 7]) {
    if (feature_value < self->low_value_vector[lVar8 + 3]) {
      if (feature_value < self->low_value_vector[lVar8 + 1]) {
        uVar9 = (uint)(*piVar6 <= feature_value);
      }
      else {
        uVar9 = feature_value < self->low_value_vector[lVar8 + 2] ^ 3;
      }
    }
    else if (feature_value < self->low_value_vector[lVar8 + 5]) {
      uVar9 = feature_value < self->low_value_vector[lVar8 + 4] ^ 5;
    }
    else {
      uVar9 = feature_value < self->low_value_vector[lVar8 + 6] ^ 7;
    }
LAB_001207b9:
    bVar3 = true;
  }
  else {
    if (feature_value < self->low_value_vector[lVar8 + 0xf]) {
      if (feature_value < self->low_value_vector[lVar8 + 0xb]) {
        if (feature_value < self->low_value_vector[lVar8 + 9]) {
          uVar9 = feature_value < self->low_value_vector[lVar8 + 8] ^ 9;
        }
        else {
          uVar9 = feature_value < self->low_value_vector[lVar8 + 10] ^ 0xb;
        }
      }
      else if (feature_value < self->low_value_vector[lVar8 + 0xd]) {
        uVar9 = feature_value < self->low_value_vector[lVar8 + 0xc] ^ 0xd;
      }
      else {
        uVar9 = feature_value < self->low_value_vector[lVar8 + 0xe] ^ 0xf;
      }
      goto LAB_001207b9;
    }
    uVar9 = 0xffffffff;
    bVar3 = false;
  }
  if (bVar3) {
    if ((int)uVar9 < 0xf) {
      lVar11 = 0xfd;
      do {
        uVar1 = *(undefined2 *)((long)self + lVar11 * 2 + lVar8 * 2 + -0xc2);
        *(undefined2 *)((long)self->downsampling_filter_states + lVar11 * 2 + lVar8 * 2 + -4) =
             *(undefined2 *)((long)self->downsampling_filter_states + lVar11 * 2 + lVar8 * 2 + -6);
        *(undefined2 *)((long)self + lVar11 * 2 + lVar8 * 2 + -0xc0) = uVar1;
        lVar13 = lVar11 + -0xef;
        lVar11 = lVar11 + -1;
      } while ((int)uVar9 < lVar13);
    }
    piVar6[uVar9] = feature_value;
    self->index_vector[lVar8 + (ulong)uVar9] = 1;
  }
  iVar2 = self->frame_counter;
  if (iVar2 < 3) {
    if (iVar2 < 1) {
      sVar4 = 0x640;
      goto LAB_0012082b;
    }
  }
  else {
    piVar6 = self->low_value_vector + lVar8 + 2;
  }
  sVar4 = *piVar6;
LAB_0012082b:
  if (iVar2 < 1) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0x7eb7;
    if (sVar4 < self->mean_value[channel]) {
      uVar9 = 0x1999;
    }
  }
  iVar5 = (int16_t)((int)sVar4 * (uVar9 ^ 0x7fff) + (int)self->mean_value[channel] * (uVar9 + 1) +
                    0x4000 >> 0xf);
  self->mean_value[channel] = iVar5;
  return iVar5;
}

Assistant:

int16_t WebRtcVad_FindMinimum(VadInstT* self,
                              int16_t feature_value,
                              int channel) {
  int i = 0, j = 0;
  int position = -1;
  // Offset to beginning of the 16 minimum values in memory.
  const int offset = (channel << 4);
  int16_t current_median = 1600;
  int16_t alpha = 0;
  int32_t tmp32 = 0;
  // Pointer to memory for the 16 minimum values and the age of each value of
  // the `channel`.
  int16_t* age = &self->index_vector[offset];
  int16_t* smallest_values = &self->low_value_vector[offset];

  RTC_DCHECK_LT(channel, kNumChannels);

  // Each value in `smallest_values` is getting 1 loop older. Update `age`, and
  // remove old values.
  for (i = 0; i < 16; i++) {
    if (age[i] != 100) {
      age[i]++;
    } else {
      // Too old value. Remove from memory and shift larger values downwards.
      for (j = i; j < 15; j++) {
        smallest_values[j] = smallest_values[j + 1];
        age[j] = age[j + 1];
      }
      age[15] = 101;
      smallest_values[15] = 10000;
    }
  }

  // Check if `feature_value` is smaller than any of the values in
  // `smallest_values`. If so, find the `position` where to insert the new value
  // (`feature_value`).
  if (feature_value < smallest_values[7]) {
    if (feature_value < smallest_values[3]) {
      if (feature_value < smallest_values[1]) {
        if (feature_value < smallest_values[0]) {
          position = 0;
        } else {
          position = 1;
        }
      } else if (feature_value < smallest_values[2]) {
        position = 2;
      } else {
        position = 3;
      }
    } else if (feature_value < smallest_values[5]) {
      if (feature_value < smallest_values[4]) {
        position = 4;
      } else {
        position = 5;
      }
    } else if (feature_value < smallest_values[6]) {
      position = 6;
    } else {
      position = 7;
    }
  } else if (feature_value < smallest_values[15]) {
    if (feature_value < smallest_values[11]) {
      if (feature_value < smallest_values[9]) {
        if (feature_value < smallest_values[8]) {
          position = 8;
        } else {
          position = 9;
        }
      } else if (feature_value < smallest_values[10]) {
        position = 10;
      } else {
        position = 11;
      }
    } else if (feature_value < smallest_values[13]) {
      if (feature_value < smallest_values[12]) {
        position = 12;
      } else {
        position = 13;
      }
    } else if (feature_value < smallest_values[14]) {
      position = 14;
    } else {
      position = 15;
    }
  }

  // If we have detected a new small value, insert it at the correct position
  // and shift larger values up.
  if (position > -1) {
    for (i = 15; i > position; i--) {
      smallest_values[i] = smallest_values[i - 1];
      age[i] = age[i - 1];
    }
    smallest_values[position] = feature_value;
    age[position] = 1;
  }

  // Get `current_median`.
  if (self->frame_counter > 2) {
    current_median = smallest_values[2];
  } else if (self->frame_counter > 0) {
    current_median = smallest_values[0];
  }

  // Smooth the median value.
  if (self->frame_counter > 0) {
    if (current_median < self->mean_value[channel]) {
      alpha = kSmoothingDown;  // 0.2 in Q15.
    } else {
      alpha = kSmoothingUp;  // 0.99 in Q15.
    }
  }
  tmp32 = (alpha + 1) * self->mean_value[channel];
  tmp32 += (WEBRTC_SPL_WORD16_MAX - alpha) * current_median;
  tmp32 += 16384;
  self->mean_value[channel] = (int16_t) (tmp32 >> 15);

  return self->mean_value[channel];
}